

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

float CB_EXPLORE_ADF::binary_search(float fhat,float delta,float sens,float tol)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar4 = 3.4028235e+38;
  if (fhat / sens <= 3.4028235e+38) {
    fVar4 = fhat / sens;
  }
  fVar3 = fVar4;
  if (delta < fVar4 * fhat * fhat) {
    iVar1 = 0x13;
    fVar3 = 0.0;
    do {
      fVar6 = (fVar3 + fVar4) * 0.5;
      fVar5 = -sens * fVar6 + fhat;
      fVar7 = (fhat * fhat - fVar5 * fVar5) * fVar6 + -delta;
      fVar5 = fVar6;
      if (fVar7 <= 0.0) {
        fVar5 = fVar4;
      }
      fVar4 = fVar5;
      fVar3 = (float)((uint)fVar3 & -(uint)(0.0 < fVar7) | ~-(uint)(0.0 < fVar7) & (uint)fVar6);
      bVar2 = iVar1 != 0;
      iVar1 = iVar1 + -1;
    } while (((tol < ABS(fVar7)) && (tol < fVar4 - fVar3)) && (bVar2));
  }
  return fVar3;
}

Assistant:

float binary_search(float fhat, float delta, float sens, float tol = 1e-6)
{
  const float maxw = min(fhat / sens, FLT_MAX);

  if (maxw * fhat * fhat <= delta)
    return maxw;

  float l = 0;
  float u = maxw;
  float w, v;

  for (int iter = 0; iter < B_SEARCH_MAX_ITER; iter++)
  {
    w = (u + l) / 2.f;
    v = w * (fhat * fhat - (fhat - sens * w) * (fhat - sens * w)) - delta;
    if (v > 0)
      u = w;
    else
      l = w;
    if (fabs(v) <= tol || u - l <= tol)
      break;
  }

  return l;
}